

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall njoy::ENDFtk::section::Base::Base(Base *this,int ZA,double AWR,int MT)

{
  char *in_RAX;
  undefined8 *puVar1;
  
  BaseWithoutMT<njoy::ENDFtk::section::Base>::BaseWithoutMT
            (&this->super_BaseWithoutMT<njoy::ENDFtk::section::Base>,ZA,AWR);
  this->MT_ = MT;
  if (0 < MT) {
    return;
  }
  tools::Log::error<char_const*>(in_RAX);
  tools::Log::info<char_const*>(in_RAX);
  tools::Log::info<char_const*,int>("Encountered section number: {}",MT);
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = getenv;
  __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

Base( int ZA, double AWR, int MT ) :
  BaseWithoutMT( ZA, AWR ), MT_( MT ) {

  if ( MT < 1 ) {

    Log::error( "Illegal section number" );
    Log::info( "Section (MT) numbers must be greater than zero" );
    Log::info( "Encountered section number: {}", MT );
    throw std::exception();
  }
}